

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_12::ScanLineProcess::run_unpack
          (ScanLineProcess *this,exr_const_context_t ctxt,int pn,DeepFrameBuffer *outfb,int fbY,
          int fbLastY,vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *filllist)

{
  undefined4 uVar1;
  char *text;
  undefined8 in_RCX;
  undefined4 in_EDX;
  ScanLineProcess *in_RSI;
  IoExc *in_RDI;
  int unaff_retaddr;
  DeepFrameBuffer *in_stack_00000008;
  ScanLineProcess *in_stack_00000010;
  vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *in_stack_00000078;
  int in_stack_00000084;
  DeepFrameBuffer *in_stack_00000088;
  ScanLineProcess *in_stack_00000090;
  undefined4 in_stack_ffffffffffffffe8;
  
  update_pointers(in_RSI,(DeepFrameBuffer *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                  (int)((ulong)in_RCX >> 0x20),(int)in_RCX);
  copy_sample_count(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (((in_RDI->super_BaseExc).field_0x5 & 1) == 0) {
    if ((*(long *)&in_RDI[2].super_BaseExc != 0) &&
       (*(long *)&in_RDI[4].super_BaseExc._stackTrace != 0)) {
      uVar1 = (**(code **)&in_RDI[4].super_BaseExc._stackTrace)(in_RDI + 1);
      *(undefined4 *)&in_RDI->super_BaseExc = uVar1;
      if (*(int *)&in_RDI->super_BaseExc != 0) {
        text = (char *)__cxa_allocate_exception(0x48);
        Iex_3_3::IoExc::IoExc(in_RDI,text);
        __cxa_throw(text,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
      }
    }
    run_fill(in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000078);
  }
  return;
}

Assistant:

void ScanLineProcess::run_unpack (
    exr_const_context_t ctxt,
    int pn,
    const DeepFrameBuffer *outfb,
    int fbY,
    int fbLastY,
    const std::vector<DeepSlice> &filllist)
{
    update_pointers (outfb, fbY, fbLastY);

    copy_sample_count (outfb, fbY);

    if (counts_only)
        return;

    /* won't work for deep where we need to re-allocate the number of
     * samples but for scenario where we have separated sample count read
     * and deep sample alloc, should be fine to bypass pipe
     * and run the unpacker */
    if (decoder.chunk.unpacked_size > 0 && decoder.unpack_and_convert_fn)
    {
        last_decode_err = decoder.unpack_and_convert_fn (&decoder);
        if (EXR_ERR_SUCCESS != last_decode_err)
            throw IEX_NAMESPACE::IoExc ("Unable to run decoder");
    }

    run_fill (outfb, fbY, filllist);
}